

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
::
Unordered_set_column<std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>>
          (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
           *this,Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
                 *column,Index columnIndex,
          map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
          *rowContainer,Column_settings *colSettings)

{
  Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
  *this_00;
  bool bVar1;
  ID_index rowIndex;
  size_type __n;
  Column_support *this_01;
  reference ppEVar2;
  uint *value;
  Entry_constructor *local_a8;
  Field_operators *local_98;
  Entry *entry;
  const_iterator __end0;
  const_iterator __begin0;
  Column_support *__range3;
  allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*>
  local_33;
  key_equal local_32;
  hasher local_31;
  Column_settings *local_30;
  Column_settings *colSettings_local;
  map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
  *rowContainer_local;
  Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
  *pUStack_18;
  Index columnIndex_local;
  Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
  *column_local;
  Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
  *this_local;
  
  local_30 = colSettings;
  colSettings_local = (Column_settings *)rowContainer;
  rowContainer_local._4_4_ = columnIndex;
  pUStack_18 = column;
  column_local = (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
                  *)this;
  Row_access<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
  ::Row_access((Row_access<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
                *)this,columnIndex,rowContainer);
  Column_dimension_holder<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
  ::Column_dimension_holder
            ((Column_dimension_holder<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
              *)(this + 0x10),&pUStack_18->super_Column_dimension_option);
  Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
  ::Chain_column_extra_properties
            ((Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
              *)(this + 0x14),&pUStack_18->super_Chain_column_option);
  __n = std::
        unordered_set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*>_>
        ::bucket_count(&pUStack_18->column_);
  std::
  allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*>
  ::allocator(&local_33);
  std::
  unordered_set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*>_>
  ::unordered_set((unordered_set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*>_>
                   *)(this + 0x20),__n,&local_31,&local_32,&local_33);
  std::
  allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*>
  ::~allocator(&local_33);
  if (local_30 == (Column_settings *)0x0) {
    local_98 = pUStack_18->operators_;
  }
  else {
    local_98 = (Field_operators *)0x0;
  }
  *(Field_operators **)(this + 0x58) = local_98;
  if (local_30 == (Column_settings *)0x0) {
    local_a8 = pUStack_18->entryPool_;
  }
  else {
    local_a8 = (Entry_constructor *)&local_30->field_0x20;
  }
  *(Entry_constructor **)(this + 0x60) = local_a8;
  if (local_30 != (Column_settings *)0x0) {
    *(Column_settings **)(this + 0x58) = local_30;
  }
  this_01 = &pUStack_18->column_;
  __end0 = std::
           unordered_set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*>_>
           ::begin(this_01);
  entry = (Entry *)std::
                   unordered_set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*>_>
                   ::end(this_01);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end0.
                        super__Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_true>
                       ,(_Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_true>
                         *)&entry);
    if (!bVar1) break;
    ppEVar2 = std::__detail::
              _Node_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_true,_true>
              ::operator*(&__end0);
    this_00 = *ppEVar2;
    value = Entry_field_element<unsigned_int>::get_element
                      (&this_00->super_Entry_field_element_option);
    rowIndex = Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
               ::get_row_index(this_00);
    Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
    ::_insert_entry((Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
                     *)this,value,rowIndex);
    std::__detail::
    _Node_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_true,_true>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

inline Unordered_set_column<Master_matrix>::Unordered_set_column(const Unordered_set_column& column,
                                                                 Index columnIndex,
                                                                 Row_container* rowContainer,
                                                                 Column_settings* colSettings)
    : RA_opt(columnIndex, rowContainer),
      Dim_opt(static_cast<const Dim_opt&>(column)),
      Chain_opt(static_cast<const Chain_opt&>(column)),
      column_(column.column_.bucket_count()),
      operators_(colSettings == nullptr ? column.operators_ : nullptr),
      entryPool_(colSettings == nullptr ? column.entryPool_ : &(colSettings->entryConstructor))
{
  if constexpr (!Master_matrix::Option_list::is_z2) {
    if (colSettings != nullptr) operators_ = &(colSettings->operators);
  }

  for (const Entry* entry : column.column_) {
    if constexpr (Master_matrix::Option_list::is_z2) {
      _insert_entry(entry->get_row_index());
    } else {
      _insert_entry(entry->get_element(), entry->get_row_index());
    }
  }
}